

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream *
QtPrivate::writeSequentialContainer<QList<long_long>>(QDataStream *s,QList<long_long> *c)

{
  ulong uVar1;
  long lVar2;
  longlong *plVar3;
  QDataStream *this;
  int iVar4;
  long lVar5;
  
  uVar1 = (c->d).size;
  if (uVar1 >> 1 < 0x7fffffff) {
    iVar4 = (int)uVar1;
  }
  else {
    if (0x15 < *(int *)(s + 0x18)) {
      this = (QDataStream *)QDataStream::operator<<(s,-2);
      QDataStream::operator<<(this,uVar1);
      goto LAB_0017ddf9;
    }
    if (uVar1 != 0xfffffffe) {
      QDataStream::setStatus((Status)s);
      return s;
    }
    iVar4 = -2;
  }
  QDataStream::operator<<(s,iVar4);
LAB_0017ddf9:
  lVar2 = (c->d).size;
  if (lVar2 != 0) {
    plVar3 = (c->d).ptr;
    lVar5 = 0;
    do {
      QDataStream::operator<<(s,*(longlong *)((long)plVar3 + lVar5));
      lVar5 = lVar5 + 8;
    } while (lVar2 << 3 != lVar5);
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}